

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlShellList(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  xmlNodePtr local_38;
  xmlNodePtr cur;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *arg_local;
  xmlShellCtxtPtr ctxt_local;
  
  if (ctxt != (xmlShellCtxtPtr)0x0) {
    if (node == (xmlNodePtr)0x0) {
      fprintf((FILE *)ctxt->output,"NULL\n");
    }
    else {
      if ((node->type == XML_DOCUMENT_NODE) || (node->type == XML_HTML_DOCUMENT_NODE)) {
        local_38 = node->children;
      }
      else {
        if (node->type == XML_NAMESPACE_DECL) {
          xmlLsOneNode(ctxt->output,node);
          return 0;
        }
        if (node->children == (_xmlNode *)0x0) {
          xmlLsOneNode(ctxt->output,node);
          return 0;
        }
        local_38 = node->children;
      }
      for (; local_38 != (xmlNodePtr)0x0; local_38 = local_38->next) {
        xmlLsOneNode(ctxt->output,local_38);
      }
    }
  }
  return 0;
}

Assistant:

int
xmlShellList(xmlShellCtxtPtr ctxt,
             char *arg ATTRIBUTE_UNUSED, xmlNodePtr node,
             xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr cur;
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if ((node->type == XML_DOCUMENT_NODE) ||
        (node->type == XML_HTML_DOCUMENT_NODE)) {
        cur = ((xmlDocPtr) node)->children;
    } else if (node->type == XML_NAMESPACE_DECL) {
        xmlLsOneNode(ctxt->output, node);
        return (0);
    } else if (node->children != NULL) {
        cur = node->children;
    } else {
        xmlLsOneNode(ctxt->output, node);
        return (0);
    }
    while (cur != NULL) {
        xmlLsOneNode(ctxt->output, cur);
        cur = cur->next;
    }
    return (0);
}